

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_parse.c
# Opt level: O2

MPP_RET avs2_split_nalu(Avs2dCtx_t *p_dec,RK_U8 *buf_start,RK_U32 buf_length,RK_U32 over_read,
                       RK_U32 *remain)

{
  RK_U8 *pRVar1;
  byte bVar2;
  RK_U8 *pRVar3;
  uint start_code;
  uint uVar4;
  RK_U32 RVar5;
  int iVar6;
  RK_U8 *pRVar7;
  int iVar8;
  uint header;
  RK_U8 *__s;
  
  pRVar7 = (RK_U8 *)(ulong)buf_length;
  pRVar1 = buf_start + -1 + (long)pRVar7;
  __s = buf_start;
  while (__s < pRVar1) {
    pRVar3 = (RK_U8 *)memchr(__s,1,(ulong)pRVar7 & 0xffffffff);
    if (pRVar3 == (RK_U8 *)0x0) break;
    if (((1 < (long)pRVar3 - (long)buf_start && pRVar3 < pRVar1) && (pRVar3[-1] == '\0')) &&
       (pRVar3[-2] == '\0')) {
      bVar2 = pRVar3[1];
      header = bVar2 + 0x100;
      if ((avs2d_parse_debug & 8) != 0) {
        _mpp_log_l(4,"avs2d_parse",
                   "Found start_code 0x%08x at offset 0x%08x, prev_starcode 0x%08x\n",
                   "avs2_split_nalu",(ulong)header,(long)(pRVar3 + 1) - (long)buf_start,
                   p_dec->prev_start_code);
      }
      iVar8 = (int)pRVar1;
      iVar6 = (int)(pRVar3 + 1);
      if (p_dec->new_seq_flag != 0) {
        if ((bVar2 == 0xb0) && ((avs2d_parse_debug & 8) != 0)) {
          _mpp_log_l(4,"avs2d_parse","Found repeated video_sequence_start_code","avs2_split_nalu");
        }
        start_code = p_dec->prev_start_code;
        if ((start_code != 0x1b2 && (start_code & 0xffffff00) == 0x100) &&
           (uVar4 = (iVar6 - (int)buf_start) - 3, RVar5 = uVar4 - over_read,
           over_read <= uVar4 && RVar5 != 0)) {
          store_nalu(p_dec,buf_start + over_read,RVar5,start_code);
          start_code = p_dec->prev_start_code;
        }
        if ((start_code - 400 < 0xffffff70) || (bVar2 < 0x90)) {
          if (bVar2 != 0xb2) {
            avs2_add_nalu_header(p_dec,header);
            if (bVar2 < 0x90) {
              store_nalu(p_dec,pRVar3 + -2,4,header);
            }
            else if (bVar2 == 0xb1) {
              p_dec->p_nals[p_dec->nal_cnt - 1].eof = '\x01';
            }
          }
          RVar5 = iVar8 - iVar6;
        }
        else {
          p_dec->new_frame_flag = 1;
          p_dec->p_nals[p_dec->nal_cnt - 1].eof = '\x01';
          RVar5 = (iVar8 - iVar6) + 4;
        }
        *remain = RVar5;
        p_dec->prev_start_code = header;
        return MPP_OK;
      }
      if (bVar2 == 0xb0) {
        if ((avs2d_parse_debug & 8) != 0) {
          _mpp_log_l(4,"avs2d_parse","Found the first video_sequence_start_code","avs2_split_nalu");
        }
        p_dec->nal_cnt = 0;
        avs2_add_nalu_header(p_dec,0x1b0);
        p_dec->prev_start_code = 0x1b0;
        p_dec->new_seq_flag = 1;
      }
      else if ((avs2d_parse_debug & 8) != 0) {
        _mpp_log_l(4,"avs2d_parse","Skip start code before first video_sequence_start_code",
                   "avs2_split_nalu");
      }
      *remain = iVar8 - iVar6;
      return MPP_OK;
    }
    pRVar7 = __s + ~(ulong)pRVar3 + ((ulong)pRVar7 & 0xffffffff);
    __s = pRVar3 + 1;
  }
  if (p_dec->new_seq_flag == 0) {
    if ((avs2d_parse_debug & 8) != 0) {
      _mpp_log_l(4,"avs2d_parse","Skip data code before first video_sequence_start_code",
                 "avs2_split_nalu");
    }
  }
  else if ((over_read <= buf_length && buf_length - over_read != 0) &&
           (p_dec->prev_start_code & 0xffffff00) == 0x100) {
    store_nalu(p_dec,buf_start + over_read,buf_length - over_read,p_dec->prev_start_code);
  }
  *remain = 0;
  return MPP_OK;
}

Assistant:

MPP_RET avs2_split_nalu(Avs2dCtx_t *p_dec, RK_U8 *buf_start, RK_U32 buf_length, RK_U32 over_read, RK_U32 *remain)
{
    MPP_RET ret = MPP_OK;

    RK_U8 *start_code_ptr = NULL;
    RK_U32 start_code = 0;
    RK_U32 nalu_len = 0;

    RK_U8 *buf_end;

    buf_end = buf_start + buf_length - 1;

    start_code = avs2_find_start_code(buf_start, buf_end, &start_code_ptr);

    if (start_code_ptr) {
        AVS2D_PARSE_TRACE("Found start_code 0x%08x at offset 0x%08x, prev_starcode 0x%08x\n",
                          start_code, start_code_ptr - buf_start, p_dec->prev_start_code);
        if (!p_dec->new_seq_flag) {
            if (start_code == AVS2_VIDEO_SEQUENCE_START_CODE) {
                AVS2D_PARSE_TRACE("Found the first video_sequence_start_code");
                p_dec->nal_cnt = 0;
                avs2_add_nalu_header(p_dec, AVS2_VIDEO_SEQUENCE_START_CODE);
                p_dec->new_seq_flag = 1;
                p_dec->prev_start_code = AVS2_VIDEO_SEQUENCE_START_CODE;
            } else {
                AVS2D_PARSE_TRACE("Skip start code before first video_sequence_start_code");
            }

            *remain = buf_end - start_code_ptr;
        } else {
            if (start_code == AVS2_VIDEO_SEQUENCE_START_CODE) {
                AVS2D_PARSE_TRACE("Found repeated video_sequence_start_code");
            }

            if (AVS2_IS_START_CODE(p_dec->prev_start_code) && p_dec->prev_start_code != AVS2_USER_DATA_START_CODE) {
                nalu_len = start_code_ptr - buf_start - 3;
                if (nalu_len > over_read) {
                    store_nalu(p_dec, buf_start + over_read, nalu_len - over_read, p_dec->prev_start_code);
                }
            }

            if (AVS2_IS_SLICE_START_CODE(p_dec->prev_start_code) && !AVS2_IS_SLICE_START_CODE(start_code)) {
                p_dec->new_frame_flag = 1;
                p_dec->p_nals[p_dec->nal_cnt - 1].eof = 1;
                *remain = buf_end - start_code_ptr + 4;
            } else {
                if (start_code != AVS2_USER_DATA_START_CODE)
                    avs2_add_nalu_header(p_dec, start_code);

                // need to put slice start code to stream buffer
                if (AVS2_IS_SLICE_START_CODE(start_code)) {
                    store_nalu(p_dec, start_code_ptr - 3, 4, start_code);
                } else if (start_code == AVS2_VIDEO_SEQUENCE_END_CODE) {
                    p_dec->p_nals[p_dec->nal_cnt - 1].eof = 1;
                }

                *remain = buf_end - start_code_ptr;
            }

            p_dec->prev_start_code = start_code;
        }
    } else {
        if (!p_dec->new_seq_flag) {
            AVS2D_PARSE_TRACE("Skip data code before first video_sequence_start_code");
        } else {
            if (AVS2_IS_START_CODE(p_dec->prev_start_code)) {
                nalu_len = buf_length;
                if (nalu_len > over_read) {
                    store_nalu(p_dec, buf_start + over_read, nalu_len - over_read, p_dec->prev_start_code);
                }
            }
        }

        *remain = 0;
    }

    return ret;
}